

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,ImGuiSliderFlags flags)

{
  ImVec2 p_max_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id_00;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiDataTypeInfo *pIVar5;
  long in_RCX;
  char *in_RDX;
  ImGuiDataType in_ESI;
  void *in_RDI;
  long in_R8;
  char *in_R9;
  float _x;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 p_v;
  uint in_stack_00000008;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImU32 frame_col;
  bool is_clamp_input;
  bool double_clicked;
  bool clicked;
  bool input_requested_by_tabbing;
  bool temp_input_is_active;
  bool hovered;
  bool temp_input_allowed;
  ImRect total_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe08;
  float text_baseline_y;
  ImRect *in_stack_fffffffffffffe10;
  ImGuiWindow *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  ImGuiWindow *in_stack_fffffffffffffe28;
  ImGuiWindow *in_stack_fffffffffffffe30;
  ImRect *in_stack_fffffffffffffe38;
  ImVec2 *align;
  ImVec2 *pIVar8;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 uVar9;
  char *in_stack_fffffffffffffe50;
  ImVec2 *in_stack_fffffffffffffe58;
  ImVec2 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  ImRect *in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  ImVec2 in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe92;
  undefined1 in_stack_fffffffffffffe94;
  byte in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 uVar10;
  undefined4 in_stack_fffffffffffffea0;
  void *pvVar11;
  ImRect *bb;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 *local_120;
  ImVec2 local_118 [9];
  byte local_c9;
  ImU32 local_b4;
  undefined1 local_af;
  byte local_ae;
  byte local_ad;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  ImVec2 local_a8;
  ImVec2 in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float local_68;
  float fStack_64;
  undefined8 local_40;
  bool local_1;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    pvVar11 = (void *)0x0;
    id_00 = ImGuiWindow::GetID(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                               in_stack_fffffffffffffe20);
    _x = CalcItemWidth();
    IVar7 = CalcTextSize((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,
                         SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0),
                         SUB84(in_stack_fffffffffffffe28,0));
    pIVar8 = &(pIVar4->DC).CursorPos;
    fStack_64 = IVar7.y;
    fVar6 = (pIVar1->Style).FramePadding.y;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,_x,fVar6 + fVar6 + fStack_64);
    p_v = operator+(in_stack_fffffffffffffe08,(ImVec2 *)0x19fd31);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff88,pIVar8,(ImVec2 *)&stack0xffffffffffffff80);
    bb = (ImRect *)&stack0xffffffffffffff88;
    local_68 = IVar7.x;
    if (local_68 <= 0.0) {
      fVar6 = 0.0;
    }
    else {
      fVar6 = (pIVar1->Style).ItemInnerSpacing.x + local_68;
    }
    ImVec2::ImVec2(&local_a8,fVar6,0.0);
    IVar7 = operator+(in_stack_fffffffffffffe08,(ImVec2 *)0x19fdf1);
    text_baseline_y = (float)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff68,&bb->Min,(ImVec2 *)&stack0xffffffffffffff60);
    local_a9 = (in_stack_00000008 & 0x80) == 0;
    ItemSize(in_stack_fffffffffffffe10,text_baseline_y);
    bVar2 = ItemAdd(in_stack_fffffffffffffe38,(ImGuiID)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe28,
                    (ImGuiItemFlags)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    if (bVar2) {
      if (in_R9 == (char *)0x0) {
        pIVar5 = DataTypeGetInfo(in_ESI);
        local_40._4_4_ = (ImGuiID)((ulong)pIVar5->PrintFmt >> 0x20);
      }
      else {
        local_40 = in_R9;
        if ((in_ESI == 4) && (iVar3 = strcmp(in_R9,"%d"), iVar3 != 0)) {
          local_40 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe18);
        }
      }
      local_aa = ItemHoverable((ImRect *)in_stack_fffffffffffffe28,
                               (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      uVar10 = false;
      if ((local_a9 & 1) != 0) {
        uVar10 = TempInputIsActive(id_00);
      }
      local_ab = uVar10;
      if ((bool)uVar10 == false) {
        in_stack_fffffffffffffe96 = false;
        if ((local_a9 & 1) != 0) {
          in_stack_fffffffffffffe96 = ((pIVar1->LastItemData).StatusFlags & 0x100U) != 0;
        }
        in_stack_fffffffffffffe95 = 0;
        if ((local_aa & 1) != 0) {
          in_stack_fffffffffffffe95 = (pIVar1->IO).MouseClicked[0];
        }
        local_ad = in_stack_fffffffffffffe95 & 1;
        in_stack_fffffffffffffe94 = false;
        if ((local_aa & 1) != 0) {
          in_stack_fffffffffffffe94 = (pIVar1->IO).MouseClickedCount[0] == 2;
        }
        local_ae = in_stack_fffffffffffffe94;
        local_ac = in_stack_fffffffffffffe96;
        if (((((bool)in_stack_fffffffffffffe96 != false) || (local_ad != 0)) ||
            ((bool)in_stack_fffffffffffffe94 != false)) ||
           ((pIVar1->NavActivateId == id_00 || (pIVar1->NavActivateInputId == id_00)))) {
          SetActiveID((ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),in_stack_fffffffffffffe18)
          ;
          SetFocusID((ImGuiID)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe28);
          FocusWindow(in_stack_fffffffffffffe30);
          pIVar1->ActiveIdUsingNavDirMask = 3;
          if (((local_a9 & 1) != 0) &&
             (((((local_ac & 1) != 0 ||
                (((local_ad & 1) != 0 && (((pIVar1->IO).KeyCtrl & 1U) != 0)))) ||
               ((local_ae & 1) != 0)) || (pIVar1->NavActivateInputId == id_00)))) {
            local_ab = 1;
          }
        }
        if ((((((pIVar1->IO).ConfigDragClickToInputText & 1U) != 0) && ((local_a9 & 1) != 0)) &&
            ((local_ab & 1) == 0)) &&
           (((pIVar1->ActiveId == id_00 && ((local_aa & 1) != 0)) &&
            ((((pIVar1->IO).MouseReleased[0] & 1U) != 0 &&
             (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), !bVar2)))))
           ) {
          pIVar1->NavActivateInputId = id_00;
          pIVar1->NavActivateId = id_00;
          pIVar1->NavActivateFlags = 1;
          local_ab = 1;
        }
      }
      if ((local_ab & 1) == 0) {
        if (pIVar1->ActiveId == id_00) {
          uVar9 = 9;
        }
        else {
          uVar9 = 7;
          if ((local_aa & 1) != 0) {
            uVar9 = 8;
          }
        }
        local_b4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                               SUB84(in_stack_fffffffffffffe20,0));
        RenderNavHighlight(bb,(ImGuiID)((ulong)pIVar8 >> 0x20),(ImGuiNavHighlightFlags)pIVar8);
        p_max_00.y = in_stack_fffffffffffffe7c;
        p_max_00.x = in_stack_fffffffffffffe78;
        RenderFrame(in_stack_fffffffffffffe80,p_max_00,
                    (ImU32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffe70 >> 0x18,0),in_stack_fffffffffffffe6c);
        pvVar11 = (void *)CONCAT44(text_baseline_y,in_stack_00000008);
        local_c9 = DragBehavior((ImGuiID)in_stack_ffffffffffffff90,
                                (ImGuiDataType)in_stack_ffffffffffffff8c,(void *)p_v,
                                in_stack_ffffffffffffff7c,(void *)in_stack_ffffffffffffff70,
                                (void *)in_stack_ffffffffffffff68,(char *)IVar7,(ImGuiSliderFlags)_x
                               );
        if ((bool)local_c9) {
          MarkItemEdited(id_00);
        }
        pIVar8 = local_118;
        iVar3 = DataTypeFormatString
                          ((char *)in_stack_fffffffffffffe18,
                           (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                           (ImGuiDataType)in_stack_fffffffffffffe10,pvVar11,(char *)0x1a047f);
        local_120 = (ImVec2 *)((long)&pIVar8->x + (long)iVar3);
        if ((pIVar1->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        align = local_120;
        ImVec2::ImVec2(&local_128,0.5,0.5);
        RenderTextClipped((ImVec2 *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                          in_stack_fffffffffffffe50,
                          (char *)CONCAT44(uVar9,in_stack_fffffffffffffe48),pIVar8,align,
                          in_stack_fffffffffffffe70);
        uVar10 = (undefined1)((uint)uVar9 >> 0x18);
        if (0.0 < local_68) {
          ImVec2::ImVec2(&local_130,in_stack_ffffffffffffff90 + (pIVar1->Style).ItemInnerSpacing.x,
                         in_stack_ffffffffffffff8c + (pIVar1->Style).FramePadding.y);
          RenderText(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                     in_stack_fffffffffffffe50,(bool)uVar10);
        }
        local_1 = (bool)(local_c9 & 1);
      }
      else {
        local_af = false;
        if ((((in_stack_00000008 & 0x10) != 0) &&
            (in_stack_fffffffffffffe92 = true, local_af = in_stack_fffffffffffffe92, in_RCX != 0))
           && (in_stack_fffffffffffffe92 = true, local_af = in_stack_fffffffffffffe92, in_R8 != 0))
        {
          iVar3 = DataTypeCompare((ImGuiDataType)SUB84(in_stack_fffffffffffffe20,0),
                                  in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          in_stack_fffffffffffffe92 = iVar3 < 0;
          local_af = in_stack_fffffffffffffe92;
        }
        local_1 = TempInputScalar((ImRect *)
                                  CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffffe96,
                                                           CONCAT15(in_stack_fffffffffffffe95,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(local_af,CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  in_stack_fffffffffffffe90)))))),local_40._4_4_,
                                  in_RDX,in_ESI,in_RDI,
                                  (char *)CONCAT44(id_00,in_stack_fffffffffffffe68),
                                  (void *)CONCAT44(fVar6,in_stack_fffffffffffffea0),pvVar11);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    const bool temp_input_allowed = (flags & ImGuiSliderFlags_NoInput) == 0;
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb, temp_input_allowed ? ImGuiItemFlags_Inputable : 0))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Drag turns it into an InputText
    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = temp_input_allowed && TempInputIsActive(id);
    if (!temp_input_is_active)
    {
        const bool input_requested_by_tabbing = temp_input_allowed && (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_FocusedByTabbing) != 0;
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        const bool double_clicked = (hovered && g.IO.MouseClickedCount[0] == 2);
        if (input_requested_by_tabbing || clicked || double_clicked || g.NavActivateId == id || g.NavActivateInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
            if (temp_input_allowed)
                if (input_requested_by_tabbing || (clicked && g.IO.KeyCtrl) || double_clicked || g.NavActivateInputId == id)
                    temp_input_is_active = true;
        }

        // Experimental: simple click (without moving) turns Drag into an InputText
        if (g.IO.ConfigDragClickToInputText && temp_input_allowed && !temp_input_is_active)
            if (g.ActiveId == id && hovered && g.IO.MouseReleased[0] && !IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
            {
                g.NavActivateId = g.NavActivateInputId = id;
                g.NavActivateFlags = ImGuiActivateFlags_PreferInput;
                temp_input_is_active = true;
            }
    }

    if (temp_input_is_active)
    {
        // Only clamp CTRL+Click input when ImGuiSliderFlags_AlwaysClamp is set
        const bool is_clamp_input = (flags & ImGuiSliderFlags_AlwaysClamp) != 0 && (p_min == NULL || p_max == NULL || DataTypeCompare(data_type, p_min, p_max) < 0);
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format, is_clamp_input ? p_min : NULL, is_clamp_input ? p_max : NULL);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    // Drag behavior
    const bool value_changed = DragBehavior(id, data_type, p_data, v_speed, p_min, p_max, format, flags);
    if (value_changed)
        MarkItemEdited(id);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    if (g.LogEnabled)
        LogSetNextTextDecoration("{", "}");
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return value_changed;
}